

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translit.cpp
# Opt level: O1

UBool icu_63::Transliterator::initializeRegistry(UErrorCode *status)

{
  UnicodeString *pUVar1;
  uint uVar2;
  int32_t iVar3;
  TransliteratorRegistry *pTVar4;
  UResourceBundle *resB;
  UResourceBundle *resB_00;
  UResourceBundle *resB_01;
  char *cs;
  UChar *pUVar5;
  Transliterator *adoptedProto;
  Transliterator *adoptedProto_00;
  Transliterator *this;
  Transliterator *this_00;
  Transliterator *adoptedProto_01;
  NameUnicodeTransliterator *this_01;
  BreakTransliterator *this_02;
  int srcLength;
  int srcStart;
  UBool UVar6;
  undefined4 uVar7;
  UErrorCode *in_RSI;
  undefined8 uVar8;
  undefined4 uVar9;
  int indexR;
  uint uVar10;
  bool visible;
  UChar type;
  int32_t len;
  UErrorCode status_1;
  int32_t len_1;
  UnicodeString id;
  UnicodeString T_PART;
  undefined1 local_216 [54];
  ConstChar16Ptr local_1e0;
  UnicodeString local_1d8;
  ConstChar16Ptr local_198;
  ConstChar16Ptr local_190;
  ConstChar16Ptr local_188;
  ConstChar16Ptr local_180;
  ConstChar16Ptr local_178;
  ConstChar16Ptr local_170;
  ConstChar16Ptr local_168;
  UnicodeString local_160;
  TransliteratorRegistry *local_120;
  UObject local_118;
  char16_t *local_110;
  char16_t *local_108;
  char16_t *local_f0;
  char16_t *local_e8;
  char16_t *local_d0;
  char16_t *local_c8;
  TransliteratorRegistry *local_b0;
  UChar *local_a0;
  UChar *local_90;
  char16_t *local_80;
  UnicodeString local_70;
  
  UVar6 = '\x01';
  if (registry == (TransliteratorRegistry *)0x0) {
    pTVar4 = (TransliteratorRegistry *)UMemory::operator_new((UMemory *)0x108,(size_t)in_RSI);
    if (pTVar4 == (TransliteratorRegistry *)0x0) {
      pTVar4 = (TransliteratorRegistry *)0x0;
    }
    else {
      in_RSI = status;
      TransliteratorRegistry::TransliteratorRegistry(pTVar4,status);
    }
    if (pTVar4 != (TransliteratorRegistry *)0x0) {
      registry = pTVar4;
      if (*status < U_ILLEGAL_ARGUMENT_ERROR) {
        local_216._14_8_ = ures_open_63("icudt63l-translit",(char *)0x0,status);
        resB = ures_getByKey_63((UResourceBundle *)local_216._14_8_,"RuleBasedTransliteratorIDs",
                                (UResourceBundle *)0x0,status);
        local_168.p_ = L"-t-";
        uVar8 = (UnicodeString *)0x1;
        icu_63::UnicodeString::UnicodeString(&local_70,'\x01',&local_168,-1);
        local_80 = local_168.p_;
        if ((*status < U_ILLEGAL_ARGUMENT_ERROR) && (uVar2 = ures_getSize_63(resB), 0 < (int)uVar2))
        {
          local_118._vptr_UObject = (_func_int **)&PTR__UnicodeString_0048be70;
          local_216._22_4_ = uVar2;
          pUVar1 = (UnicodeString *)0x0;
          do {
            uVar8 = pUVar1;
            indexR = (int)uVar8;
            resB_00 = ures_getByIndex_63(resB,indexR,(UResourceBundle *)0x0,status);
            if (*status < U_ILLEGAL_ARGUMENT_ERROR) {
              uVar8 = ures_getKey_63(resB_00);
              icu_63::UnicodeString::UnicodeString(&local_160,(char *)uVar8,-1,kInvariant);
              uVar9 = local_160.fUnion.fFields.fLength;
              if (-1 < local_160.fUnion.fStackFields.fLengthAndFlags) {
                uVar9 = (int)local_160.fUnion.fStackFields.fLengthAndFlags >> 5;
              }
              iVar3 = -1;
              if ((local_70.fUnion.fStackFields.fLengthAndFlags & 1U) == 0) {
                uVar7 = local_70.fUnion.fFields.fLength;
                if (-1 < local_70.fUnion.fStackFields.fLengthAndFlags) {
                  uVar7 = (int)local_70.fUnion.fStackFields.fLengthAndFlags >> 5;
                }
                srcStart = 0;
                if ((int)uVar7 < 0) {
                  srcStart = uVar7;
                }
                srcLength = uVar7 - srcStart;
                if ((int)uVar7 <= uVar7 - srcStart) {
                  srcLength = uVar7;
                }
                uVar8 = (UnicodeString *)0x0;
                if ((int)uVar7 < 0) {
                  srcLength = 0;
                }
                if (0 < srcLength) {
                  uVar8 = local_70.fUnion.fStackFields.fBuffer;
                  if ((local_70.fUnion.fStackFields.fLengthAndFlags & 2U) == 0) {
                    uVar8 = local_70.fUnion.fFields.fArray;
                  }
                  iVar3 = icu_63::UnicodeString::indexOf
                                    (&local_160,(UChar *)uVar8,srcStart,srcLength,0,uVar9);
                }
              }
              if (iVar3 == -1) {
                resB_01 = ures_getNextResource_63(resB_00,(UResourceBundle *)0x0,status);
                cs = ures_getKey_63(resB_01);
                uVar8 = local_216;
                u_charsToUChars_63(cs,(UChar *)uVar8,1);
                if (*status < U_ILLEGAL_ARGUMENT_ERROR) {
                  local_216._2_4_ = 0;
                  if (local_216._0_2_ == 0x61) {
                    local_216._46_8_ = ures_getString_63(resB_01,(int32_t *)(local_216 + 2),status);
                    local_216._38_8_ = registry;
                    icu_63::UnicodeString::UnicodeString
                              (&local_1d8,'\x01',(ConstChar16Ptr *)(local_216 + 0x2e),
                               local_216._2_4_);
                    uVar8 = &local_160;
                    TransliteratorRegistry::put
                              ((TransliteratorRegistry *)local_216._38_8_,(UnicodeString *)uVar8,
                               &local_1d8,'\x01','\x01',status);
                    icu_63::UnicodeString::~UnicodeString(&local_1d8);
                    local_90 = (UChar *)local_216._46_8_;
                  }
                  else if ((local_216._0_2_ == 0x66) || (local_216._0_2_ == 0x69)) {
                    local_216._38_8_ =
                         ures_getStringByKey_63
                                   (resB_01,"resource",(int32_t *)(local_216 + 2),status);
                    visible = local_216._0_2_ == 0x66;
                    local_1d8.super_Replaceable.super_UObject._vptr_UObject =
                         (UObject)(UObject)local_118._vptr_UObject;
                    local_1d8.fUnion.fStackFields.fLengthAndFlags = 2;
                    local_216._34_4_ = 0;
                    pUVar5 = ures_getStringByKey_63
                                       (resB_01,"direction",(int32_t *)(local_216 + 0x22),status);
                    if (*status < U_ILLEGAL_ARGUMENT_ERROR) {
                      local_216._6_8_ = pUVar5;
                      icu_63::UnicodeString::setTo
                                (&local_1d8,'\x01',(ConstChar16Ptr *)(local_216 + 6),
                                 local_216._34_4_);
                      local_a0 = (UChar *)local_216._6_8_;
                    }
                    else {
                      icu_63::UnicodeString::setToBogus(&local_1d8);
                    }
                    uVar9 = local_1d8.fUnion.fFields.fLength;
                    if (-1 < local_1d8.fUnion.fStackFields.fLengthAndFlags) {
                      uVar9 = (int)local_1d8.fUnion.fStackFields.fLengthAndFlags >> 5;
                    }
                    if (uVar9 == 0) {
                      local_216._30_4_ = UTRANS_REVERSE;
                    }
                    else {
                      uVar8 = local_1d8.fUnion.fStackFields.fBuffer;
                      if (((int)local_1d8.fUnion.fStackFields.fLengthAndFlags & 2U) == 0) {
                        uVar8 = local_1d8.fUnion.fFields.fArray;
                      }
                      local_216._30_4_ = ZEXT14(*(char16_t *)uVar8 != L'F');
                    }
                    icu_63::UnicodeString::~UnicodeString(&local_1d8);
                    local_120 = registry;
                    local_1e0.p_ = (char16_t *)local_216._38_8_;
                    icu_63::UnicodeString::UnicodeString
                              (&local_1d8,'\x01',&local_1e0,local_216._2_4_);
                    uVar8 = &local_160;
                    TransliteratorRegistry::put
                              (local_120,(UnicodeString *)uVar8,&local_1d8,local_216._30_4_,'\x01',
                               visible,status);
                    icu_63::UnicodeString::~UnicodeString(&local_1d8);
                    local_b0 = (TransliteratorRegistry *)local_1e0.p_;
                  }
                }
                ures_close_63(resB_01);
              }
              else {
                ures_close_63(resB_00);
              }
              icu_63::UnicodeString::~UnicodeString(&local_160);
              uVar2 = local_216._22_4_;
              if (iVar3 == -1) goto LAB_00276634;
            }
            else {
LAB_00276634:
              ures_close_63(resB_00);
            }
            uVar10 = indexR + 1;
            pUVar1 = (UnicodeString *)(ulong)uVar10;
          } while (uVar2 != uVar10);
        }
        ures_close_63(resB);
        ures_close_63((UResourceBundle *)local_216._14_8_);
        adoptedProto = (Transliterator *)UMemory::operator_new((UMemory *)0x58,uVar8);
        if (adoptedProto == (Transliterator *)0x0) {
          adoptedProto = (Transliterator *)0x0;
        }
        else {
          NullTransliterator::NullTransliterator((NullTransliterator *)adoptedProto);
        }
        adoptedProto_00 = (Transliterator *)UMemory::operator_new((UMemory *)0x60,uVar8);
        if (adoptedProto_00 == (Transliterator *)0x0) {
          adoptedProto_00 = (Transliterator *)0x0;
        }
        else {
          LowercaseTransliterator::LowercaseTransliterator
                    ((LowercaseTransliterator *)adoptedProto_00);
        }
        this = (Transliterator *)UMemory::operator_new((UMemory *)0x60,uVar8);
        if (this == (Transliterator *)0x0) {
          this = (Transliterator *)0x0;
        }
        else {
          UppercaseTransliterator::UppercaseTransliterator((UppercaseTransliterator *)this);
        }
        this_00 = (Transliterator *)UMemory::operator_new((UMemory *)0x60,uVar8);
        if (this_00 == (Transliterator *)0x0) {
          this_00 = (Transliterator *)0x0;
        }
        else {
          TitlecaseTransliterator::TitlecaseTransliterator((TitlecaseTransliterator *)this_00);
        }
        adoptedProto_01 = (Transliterator *)UMemory::operator_new((UMemory *)0x58,uVar8);
        local_216._14_8_ = this_00;
        if (adoptedProto_01 == (Transliterator *)0x0) {
          adoptedProto_01 = (Transliterator *)0x0;
        }
        else {
          uVar8 = (UnicodeString *)0x0;
          UnicodeNameTransliterator::UnicodeNameTransliterator
                    ((UnicodeNameTransliterator *)adoptedProto_01,(UnicodeFilter *)0x0);
        }
        this_01 = (NameUnicodeTransliterator *)UMemory::operator_new((UMemory *)0xb0,uVar8);
        local_216._22_8_ = this;
        if (this_01 == (NameUnicodeTransliterator *)0x0) {
          this_01 = (NameUnicodeTransliterator *)0x0;
        }
        else {
          uVar8 = (UnicodeString *)0x0;
          NameUnicodeTransliterator::NameUnicodeTransliterator(this_01,(UnicodeFilter *)0x0);
        }
        this_02 = (BreakTransliterator *)UMemory::operator_new((UMemory *)0xa8,uVar8);
        if (this_02 == (BreakTransliterator *)0x0) {
          this_02 = (BreakTransliterator *)0x0;
        }
        else {
          uVar8 = (UnicodeString *)0x0;
          BreakTransliterator::BreakTransliterator(this_02,(UnicodeFilter *)0x0);
        }
        if ((((this_01 == (NameUnicodeTransliterator *)0x0) ||
             (adoptedProto == (Transliterator *)0x0)) || (adoptedProto_00 == (Transliterator *)0x0))
           || ((((Transliterator *)local_216._22_8_ == (Transliterator *)0x0 ||
                ((Transliterator *)local_216._14_8_ == (Transliterator *)0x0)) ||
               ((adoptedProto_01 == (Transliterator *)0x0 || (this_02 == (BreakTransliterator *)0x0)
                ))))) {
          if (adoptedProto != (Transliterator *)0x0) {
            (*(adoptedProto->super_UObject)._vptr_UObject[1])(adoptedProto);
          }
          if (adoptedProto_00 != (Transliterator *)0x0) {
            (*(adoptedProto_00->super_UObject)._vptr_UObject[1])(adoptedProto_00);
          }
          if ((Transliterator *)local_216._22_8_ != (Transliterator *)0x0) {
            (**(code **)(*(long *)local_216._22_8_ + 8))();
          }
          if ((Transliterator *)local_216._14_8_ != (Transliterator *)0x0) {
            (**(code **)(*(long *)local_216._14_8_ + 8))();
          }
          if (adoptedProto_01 != (Transliterator *)0x0) {
            (*(adoptedProto_01->super_UObject)._vptr_UObject[1])(adoptedProto_01);
          }
          if (this_01 != (NameUnicodeTransliterator *)0x0) {
            (*(this_01->super_Transliterator).super_UObject._vptr_UObject[1])(this_01);
          }
          if (this_02 != (BreakTransliterator *)0x0) {
            (*(this_02->super_Transliterator).super_UObject._vptr_UObject[1])(this_02);
          }
          pTVar4 = registry;
          if (registry != (TransliteratorRegistry *)0x0) {
            TransliteratorRegistry::~TransliteratorRegistry(registry);
            UMemory::operator_delete((UMemory *)pTVar4,(void *)uVar8);
          }
          registry = (TransliteratorRegistry *)0x0;
          *status = U_MEMORY_ALLOCATION_ERROR;
          UVar6 = '\0';
        }
        else {
          TransliteratorRegistry::put(registry,adoptedProto,'\x01',status);
          TransliteratorRegistry::put(registry,adoptedProto_00,'\x01',status);
          TransliteratorRegistry::put(registry,(Transliterator *)local_216._22_8_,'\x01',status);
          TransliteratorRegistry::put(registry,(Transliterator *)local_216._14_8_,'\x01',status);
          TransliteratorRegistry::put(registry,adoptedProto_01,'\x01',status);
          TransliteratorRegistry::put(registry,&this_01->super_Transliterator,'\x01',status);
          TransliteratorRegistry::put(registry,&this_02->super_Transliterator,'\0',status);
          RemoveTransliterator::registerIDs();
          EscapeTransliterator::registerIDs();
          UnescapeTransliterator::registerIDs();
          NormalizationTransliterator::registerIDs();
          AnyTransliterator::registerIDs();
          local_170.p_ = L"Null";
          icu_63::UnicodeString::UnicodeString(&local_160,'\x01',&local_170,-1);
          local_178.p_ = L"Null";
          icu_63::UnicodeString::UnicodeString(&local_1d8,'\x01',&local_178,-1);
          local_216._6_8_ = local_216._6_8_ & 0xffffffff00000000;
          TransliteratorIDParser::registerSpecialInverse
                    (&local_160,&local_1d8,'\0',(UErrorCode *)(local_216 + 6));
          icu_63::UnicodeString::~UnicodeString(&local_1d8);
          local_c8 = local_178.p_;
          icu_63::UnicodeString::~UnicodeString(&local_160);
          local_d0 = local_170.p_;
          local_180.p_ = L"Upper";
          icu_63::UnicodeString::UnicodeString(&local_160,'\x01',&local_180,-1);
          local_188.p_ = L"Lower";
          icu_63::UnicodeString::UnicodeString(&local_1d8,'\x01',&local_188,-1);
          local_216._6_8_ = local_216._6_8_ & 0xffffffff00000000;
          TransliteratorIDParser::registerSpecialInverse
                    (&local_160,&local_1d8,'\x01',(UErrorCode *)(local_216 + 6));
          icu_63::UnicodeString::~UnicodeString(&local_1d8);
          local_e8 = local_188.p_;
          icu_63::UnicodeString::~UnicodeString(&local_160);
          local_f0 = local_180.p_;
          local_190.p_ = L"Title";
          icu_63::UnicodeString::UnicodeString(&local_160,'\x01',&local_190,-1);
          local_198.p_ = L"Lower";
          icu_63::UnicodeString::UnicodeString(&local_1d8,'\x01',&local_198,-1);
          local_216._6_8_ = local_216._6_8_ & 0xffffffff00000000;
          TransliteratorIDParser::registerSpecialInverse
                    (&local_160,&local_1d8,'\0',(UErrorCode *)(local_216 + 6));
          icu_63::UnicodeString::~UnicodeString(&local_1d8);
          local_108 = local_198.p_;
          icu_63::UnicodeString::~UnicodeString(&local_160);
          local_110 = local_190.p_;
          UVar6 = '\x01';
          ucln_i18n_registerCleanup_63(UCLN_I18N_TRANSLITERATOR,utrans_transliterator_cleanup_63);
        }
        icu_63::UnicodeString::~UnicodeString(&local_70);
        return UVar6;
      }
      if (pTVar4 != (TransliteratorRegistry *)0x0) {
        TransliteratorRegistry::~TransliteratorRegistry(pTVar4);
        UMemory::operator_delete((UMemory *)pTVar4,in_RSI);
      }
    }
    registry = (TransliteratorRegistry *)0x0;
    UVar6 = '\0';
  }
  return UVar6;
}

Assistant:

UBool Transliterator::initializeRegistry(UErrorCode &status) {
    if (registry != 0) {
        return TRUE;
    }

    registry = new TransliteratorRegistry(status);
    if (registry == 0 || U_FAILURE(status)) {
        delete registry;
        registry = 0;
        return FALSE; // can't create registry, no recovery
    }

    /* The following code parses the index table located in
     * icu/data/translit/root.txt.  The index is an n x 4 table
     * that follows this format:
     *  <id>{
     *      file{
     *          resource{"<resource>"}
     *          direction{"<direction>"}
     *      }
     *  }
     *  <id>{
     *      internal{
     *          resource{"<resource>"}
     *          direction{"<direction"}
     *       }
     *  }
     *  <id>{
     *      alias{"<getInstanceArg"}
     *  }
     * <id> is the ID of the system transliterator being defined.  These
     * are public IDs enumerated by Transliterator.getAvailableIDs(),
     * unless the second field is "internal".
     * 
     * <resource> is a ResourceReader resource name.  Currently these refer
     * to file names under com/ibm/text/resources.  This string is passed
     * directly to ResourceReader, together with <encoding>.
     * 
     * <direction> is either "FORWARD" or "REVERSE".
     * 
     * <getInstanceArg> is a string to be passed directly to
     * Transliterator.getInstance().  The returned Transliterator object
     * then has its ID changed to <id> and is returned.
     *
     * The extra blank field on "alias" lines is to make the array square.
     */
    //static const char translit_index[] = "translit_index";

    UResourceBundle *bundle, *transIDs, *colBund;
    bundle = ures_open(U_ICUDATA_TRANSLIT, NULL/*open default locale*/, &status);
    transIDs = ures_getByKey(bundle, RB_RULE_BASED_IDS, 0, &status);
    const UnicodeString T_PART = UNICODE_STRING_SIMPLE("-t-");

    int32_t row, maxRows;
    if (U_SUCCESS(status)) {
        maxRows = ures_getSize(transIDs);
        for (row = 0; row < maxRows; row++) {
            colBund = ures_getByIndex(transIDs, row, 0, &status);
            if (U_SUCCESS(status)) {
                UnicodeString id(ures_getKey(colBund), -1, US_INV);
                if(id.indexOf(T_PART) != -1) {
                    ures_close(colBund);
                    continue;
                }
                UResourceBundle* res = ures_getNextResource(colBund, NULL, &status);
                const char* typeStr = ures_getKey(res);
                UChar type;
                u_charsToUChars(typeStr, &type, 1);

                if (U_SUCCESS(status)) {
                    int32_t len = 0;
                    const UChar *resString;
                    switch (type) {
                    case 0x66: // 'f'
                    case 0x69: // 'i'
                        // 'file' or 'internal';
                        // row[2]=resource, row[3]=direction
                        {
                            
                            resString = ures_getStringByKey(res, "resource", &len, &status);
                            UBool visible = (type == 0x0066 /*f*/);
                            UTransDirection dir = 
                                (ures_getUnicodeStringByKey(res, "direction", &status).charAt(0) ==
                                 0x0046 /*F*/) ?
                                UTRANS_FORWARD : UTRANS_REVERSE;
                            registry->put(id, UnicodeString(TRUE, resString, len), dir, TRUE, visible, status);
                        }
                        break;
                    case 0x61: // 'a'
                        // 'alias'; row[2]=createInstance argument
                        resString = ures_getString(res, &len, &status);
                        registry->put(id, UnicodeString(TRUE, resString, len), TRUE, TRUE, status);
                        break;
                    }
                }
                ures_close(res);
            }
            ures_close(colBund);
        }
    }

    ures_close(transIDs);
    ures_close(bundle);

    // Manually add prototypes that the system knows about to the
    // cache.  This is how new non-rule-based transliterators are
    // added to the system.
    
    // This is to allow for null pointer check
    NullTransliterator* tempNullTranslit = new NullTransliterator();
    LowercaseTransliterator* tempLowercaseTranslit = new LowercaseTransliterator();
    UppercaseTransliterator* tempUppercaseTranslit = new UppercaseTransliterator();
    TitlecaseTransliterator* tempTitlecaseTranslit = new TitlecaseTransliterator();
    UnicodeNameTransliterator* tempUnicodeTranslit = new UnicodeNameTransliterator();
    NameUnicodeTransliterator* tempNameUnicodeTranslit = new NameUnicodeTransliterator();
#if !UCONFIG_NO_BREAK_ITERATION
     // TODO: could or should these transliterators be referenced polymorphically once constructed?
     BreakTransliterator* tempBreakTranslit         = new BreakTransliterator();
#endif
    // Check for null pointers
    if (tempNullTranslit == NULL || tempLowercaseTranslit == NULL || tempUppercaseTranslit == NULL ||
        tempTitlecaseTranslit == NULL || tempUnicodeTranslit == NULL || 
#if !UCONFIG_NO_BREAK_ITERATION
        tempBreakTranslit == NULL ||
#endif
        tempNameUnicodeTranslit == NULL )
    {
        delete tempNullTranslit;
        delete tempLowercaseTranslit;
        delete tempUppercaseTranslit;
        delete tempTitlecaseTranslit;
        delete tempUnicodeTranslit;
        delete tempNameUnicodeTranslit;
#if !UCONFIG_NO_BREAK_ITERATION
        delete tempBreakTranslit;
#endif
        // Since there was an error, remove registry
        delete registry;
        registry = NULL;

        status = U_MEMORY_ALLOCATION_ERROR;
        return 0;
    }

    registry->put(tempNullTranslit, TRUE, status);
    registry->put(tempLowercaseTranslit, TRUE, status);
    registry->put(tempUppercaseTranslit, TRUE, status);
    registry->put(tempTitlecaseTranslit, TRUE, status);
    registry->put(tempUnicodeTranslit, TRUE, status);
    registry->put(tempNameUnicodeTranslit, TRUE, status);
#if !UCONFIG_NO_BREAK_ITERATION
    registry->put(tempBreakTranslit, FALSE, status);   // FALSE means invisible.
#endif

    RemoveTransliterator::registerIDs(); // Must be within mutex
    EscapeTransliterator::registerIDs();
    UnescapeTransliterator::registerIDs();
    NormalizationTransliterator::registerIDs();
    AnyTransliterator::registerIDs();

    _registerSpecialInverse(UNICODE_STRING_SIMPLE("Null"),
                            UNICODE_STRING_SIMPLE("Null"), FALSE);
    _registerSpecialInverse(UNICODE_STRING_SIMPLE("Upper"),
                            UNICODE_STRING_SIMPLE("Lower"), TRUE);
    _registerSpecialInverse(UNICODE_STRING_SIMPLE("Title"),
                            UNICODE_STRING_SIMPLE("Lower"), FALSE);

    ucln_i18n_registerCleanup(UCLN_I18N_TRANSLITERATOR, utrans_transliterator_cleanup);

    return TRUE;
}